

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svglayoutstate.cpp
# Opt level: O0

WhiteSpace lunasvg::parseWhiteSpace(string_view *input)

{
  WhiteSpace WVar1;
  string_view *input_local;
  
  WVar1 = parseEnumValue<lunasvg::WhiteSpace,7u>(input,&parseWhiteSpace::entries,Default);
  return WVar1;
}

Assistant:

static WhiteSpace parseWhiteSpace(const std::string_view& input)
{
    static const SVGEnumerationEntry<WhiteSpace> entries[] = {
        {WhiteSpace::Default, "default"},
        {WhiteSpace::Preserve, "preserve"},
        {WhiteSpace::Default, "normal"},
        {WhiteSpace::Default, "nowrap"},
        {WhiteSpace::Default, "pre-line"},
        {WhiteSpace::Preserve, "pre-wrap"},
        {WhiteSpace::Preserve, "pre"}
    };

    return parseEnumValue(input, entries, WhiteSpace::Default);
}